

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer_allocator.cpp
# Opt level: O1

torrent_peer * __thiscall
libtorrent::torrent_peer_allocator::allocate_peer_entry(torrent_peer_allocator *this,int type)

{
  void *ret;
  torrent_peer *ptVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (type == 2) {
    ptVar1 = (torrent_peer *)
             (this->m_i2p_peer_pool).super_simple_segregated_storage<unsigned_long>.first;
    if (ptVar1 == (torrent_peer *)0x0) {
      ptVar1 = (torrent_peer *)
               boost::pool<boost::default_user_allocator_new_delete>::malloc_need_resize
                         (&this->m_i2p_peer_pool);
    }
    else {
      (this->m_i2p_peer_pool).super_simple_segregated_storage<unsigned_long>.first =
           *(void **)ptVar1;
    }
    if (ptVar1 != (torrent_peer *)0x0) {
      iVar2 = 0x28;
      lVar4 = 0x28;
      lVar3 = 0x98;
      lVar5 = 0xa0;
LAB_00308293:
      *(undefined8 *)
       ((long)&(this->super_torrent_peer_allocator_interface)._vptr_torrent_peer_allocator_interface
       + lVar5) = 500;
      *(undefined8 *)
       ((long)&(this->super_torrent_peer_allocator_interface)._vptr_torrent_peer_allocator_interface
       + lVar3) = 500;
      this->m_total_bytes = this->m_total_bytes + lVar4;
      this->m_live_bytes = this->m_live_bytes + iVar2;
      this->m_live_allocations = this->m_live_allocations + 1;
      this->m_total_allocations = this->m_total_allocations + 1;
      return ptVar1;
    }
  }
  else if (type == 1) {
    ptVar1 = (torrent_peer *)
             (this->m_ipv6_peer_pool).super_simple_segregated_storage<unsigned_long>.first;
    if (ptVar1 == (torrent_peer *)0x0) {
      ptVar1 = (torrent_peer *)
               boost::pool<boost::default_user_allocator_new_delete>::malloc_need_resize
                         (&this->m_ipv6_peer_pool);
    }
    else {
      (this->m_ipv6_peer_pool).super_simple_segregated_storage<unsigned_long>.first =
           *(void **)ptVar1;
    }
    if (ptVar1 != (torrent_peer *)0x0) {
      iVar2 = 0x30;
      lVar4 = 0x30;
      lVar3 = 0x60;
      lVar5 = 0x68;
      goto LAB_00308293;
    }
  }
  else if (type == 0) {
    ptVar1 = (torrent_peer *)
             (this->m_ipv4_peer_pool).super_simple_segregated_storage<unsigned_long>.first;
    if (ptVar1 == (torrent_peer *)0x0) {
      ptVar1 = (torrent_peer *)
               boost::pool<boost::default_user_allocator_new_delete>::malloc_need_resize
                         (&this->m_ipv4_peer_pool);
    }
    else {
      (this->m_ipv4_peer_pool).super_simple_segregated_storage<unsigned_long>.first =
           *(void **)ptVar1;
    }
    if (ptVar1 != (torrent_peer *)0x0) {
      iVar2 = 0x28;
      lVar3 = 0x28;
      lVar5 = 0x30;
      lVar4 = 0x28;
      goto LAB_00308293;
    }
  }
  return (torrent_peer *)0x0;
}

Assistant:

torrent_peer* torrent_peer_allocator::allocate_peer_entry(int type)
	{
		TORRENT_ASSERT(m_in_use);
		torrent_peer* p = nullptr;
		switch(type)
		{
			case torrent_peer_allocator_interface::ipv4_peer_type:
				p = static_cast<torrent_peer*>(m_ipv4_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_ipv4_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(libtorrent::ipv4_peer);
				m_live_bytes += sizeof(libtorrent::ipv4_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
			case torrent_peer_allocator_interface::ipv6_peer_type:
				p = static_cast<torrent_peer*>(m_ipv6_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_ipv6_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(libtorrent::ipv6_peer);
				m_live_bytes += sizeof(libtorrent::ipv6_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
#if TORRENT_USE_I2P
			case torrent_peer_allocator_interface::i2p_peer_type:
				p = static_cast<torrent_peer*>(m_i2p_peer_pool.malloc());
				if (p == nullptr) return nullptr;
				m_i2p_peer_pool.set_next_size(500);
				m_total_bytes += sizeof(libtorrent::i2p_peer);
				m_live_bytes += sizeof(libtorrent::i2p_peer);
				++m_live_allocations;
				++m_total_allocations;
				break;
#endif
		}
		return p;
	}